

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhMapLoadPage(lhash_kv_engine *pEngine,lhash_bmap_page *pMap,uchar *zRaw)

{
  int iVar1;
  uint local_4c;
  int rc;
  sxu32 n;
  pgno iReal;
  pgno iLogic;
  uchar *zPtr;
  uchar *zEnd;
  uchar *zRaw_local;
  lhash_bmap_page *pMap_local;
  lhash_kv_engine *pEngine_local;
  
  zPtr = zRaw + pEngine->iPageSize;
  iLogic = (pgno)zRaw;
  zRaw_local = (uchar *)pMap;
  pMap_local = (lhash_bmap_page *)pEngine;
  if (pMap->iPtr == 0) {
    zEnd = zRaw;
    SyBigEndianUnpack64(zRaw,&pMap->iNext);
    zEnd = zEnd + 8;
    SyBigEndianUnpack32(zEnd,(sxu32 *)(zRaw_local + 0xc));
    zEnd = zEnd + 4;
  }
  else {
    zEnd = zRaw + (int)(uint)pMap->iPtr;
  }
  local_4c = 0;
  while ((local_4c < *(uint *)(zRaw_local + 0xc) && (zEnd < zPtr))) {
    SyBigEndianUnpack64(zEnd,&iReal);
    zEnd = zEnd + 8;
    SyBigEndianUnpack64(zEnd,(sxu64 *)&rc);
    zEnd = zEnd + 8;
    iVar1 = lhMapInstallBucket((lhash_kv_engine *)pMap_local,iReal,_rc);
    if (iVar1 != 0) {
      return iVar1;
    }
    local_4c = local_4c + 1;
  }
  *(short *)(zRaw_local + 8) = (short)zEnd - (short)iLogic;
  return 0;
}

Assistant:

static int lhMapLoadPage(lhash_kv_engine *pEngine,lhash_bmap_page *pMap,const unsigned char *zRaw)
{
	const unsigned char *zEnd = &zRaw[pEngine->iPageSize];
	const unsigned char *zPtr = zRaw;
	pgno iLogic,iReal;
	sxu32 n;
	int rc;
	if( pMap->iPtr == 0 ){
		/* Read the map header */
		SyBigEndianUnpack64(zRaw,&pMap->iNext);
		zRaw += 8;
		SyBigEndianUnpack32(zRaw,&pMap->nRec);
		zRaw += 4;
	}else{
		/* Mostly page one of the database */
		zRaw += pMap->iPtr;
	}
	/* Start processing */
	for( n = 0; n < pMap->nRec ; ++n ){
		if( zRaw >= zEnd ){
			break;
		}
		/* Extract the logical and real bucket number */
		SyBigEndianUnpack64(zRaw,&iLogic);
		zRaw += 8;
		SyBigEndianUnpack64(zRaw,&iReal);
		zRaw += 8;
		/* Install the record in the map */
		rc = lhMapInstallBucket(pEngine,iLogic,iReal);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	pMap->iPtr = (sxu16)(zRaw-zPtr);
	/* All done */
	return UNQLITE_OK;
}